

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_rate_adapted_fer.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  unsigned_long uVar1;
  ostream *poVar2;
  size_t sVar3;
  rep rVar4;
  string *generalProgramDescriptionForHelpText;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  pair<unsigned_long,_unsigned_long> pVar9;
  duration<long,_std::ratio<1L,_1000000000L>_> local_d28;
  duration<long,_std::ratio<1L,_1L>_> local_d20;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_d18;
  time_point now;
  double naive_fer;
  size_t num_frames_tested;
  size_t num_frame_errors;
  pair<unsigned_long,_unsigned_long> result;
  time_point begin;
  mt19937_64 rng;
  RateAdaptiveCode<unsigned_int> H;
  string local_298;
  size_t local_278;
  unsigned_long n_line_combs;
  string local_268;
  undefined1 local_248 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rate_adaption_file_path;
  string local_220;
  undefined1 local_200 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> code_file_path;
  string local_1d8;
  unsigned_long local_1b8;
  unsigned_long update_console_every_n_frames;
  string local_1a8;
  unsigned_long local_188;
  unsigned_long rng_seed;
  string local_178;
  unsigned_long local_158;
  unsigned_long max_bp_iter;
  string local_148;
  unsigned_long local_128;
  unsigned_long quit_at_n_errors;
  string local_118;
  unsigned_long local_f8;
  unsigned_long max_num_frames_to_test;
  string local_e8;
  double local_c8;
  double p;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_88 [8];
  Parser parser;
  char **argv_local;
  int argc_local;
  
  parser._commands.
  super__Vector_base<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,
             "Frame Error Rate (FER) Simulator for Rate Adapted LDPC Codes\n\nThis software is used to \n- load an LDPC code (from a .cscmat or bincsc.json file storing the full binary LDPC matrix in compressed sparse column (CSC) format, no QC exponents allowed!)\n- load rate adaption (from a csv file, list of pairs of row indices combined at each rate adaption step)    (this is optional; without rate adaption, only FER of the LDPC code can be simulated)\n- Simulate the FER of the given LDPC code at specified amount of rate adaption."
             ,&local_a9);
  generalProgramDescriptionForHelpText = &local_a8;
  cli::Parser::Parser((Parser *)local_88,argc,argv,generalProgramDescriptionForHelpText);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  configure_parser((Parser *)local_88);
  cli::Parser::run_and_exit_if_error((Parser *)local_88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"p",(allocator<char> *)((long)&max_num_frames_to_test + 7));
  dVar6 = cli::Parser::get<double>((Parser *)local_88,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&max_num_frames_to_test + 7));
  local_c8 = dVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"mf",(allocator<char> *)((long)&quit_at_n_errors + 7));
  uVar1 = cli::Parser::get<unsigned_long>((Parser *)local_88,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&quit_at_n_errors + 7));
  local_f8 = uVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,"me",(allocator<char> *)((long)&max_bp_iter + 7));
  uVar1 = cli::Parser::get<unsigned_long>((Parser *)local_88,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)((long)&max_bp_iter + 7));
  local_128 = uVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,"i",(allocator<char> *)((long)&rng_seed + 7));
  uVar1 = cli::Parser::get<unsigned_long>((Parser *)local_88,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rng_seed + 7));
  local_158 = uVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"s",(allocator<char> *)((long)&update_console_every_n_frames + 7))
  ;
  uVar1 = cli::Parser::get<unsigned_long>((Parser *)local_88,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&update_console_every_n_frames + 7));
  local_188 = uVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"upn",
             (allocator<char> *)(code_file_path.field_2._M_local_buf + 0xf));
  uVar1 = cli::Parser::get<unsigned_long>((Parser *)local_88,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)(code_file_path.field_2._M_local_buf + 0xf));
  local_1b8 = uVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"cp",
             (allocator<char> *)(rate_adaption_file_path.field_2._M_local_buf + 0xf));
  cli::Parser::get<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
             (Parser *)local_88,&local_220);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator
            ((allocator<char> *)(rate_adaption_file_path.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"rp",(allocator<char> *)((long)&n_line_combs + 7));
  cli::Parser::get<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248,
             (Parser *)local_88,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)((long)&n_line_combs + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"rn",(allocator<char> *)((long)&H.n_ra_rows + 7));
  uVar1 = cli::Parser::get<unsigned_long>((Parser *)local_88,&local_298);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)((long)&H.n_ra_rows + 7));
  local_278 = uVar1;
  LDPC4QKD::CodeSimulationHelpers::load_ldpc<bool,unsigned_int,unsigned_int>
            ((RateAdaptiveCode<unsigned_int> *)&rng._M_p,(CodeSimulationHelpers *)local_200,
             (string *)local_248,generalProgramDescriptionForHelpText);
  LDPC4QKD::RateAdaptiveCode<unsigned_int>::set_rate
            ((RateAdaptiveCode<unsigned_int> *)&rng._M_p,local_278);
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Code path: \'");
  poVar2 = std::operator<<(poVar2,(string *)local_200);
  std::operator<<(poVar2,"\'\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Rate adaption path: \'");
  poVar2 = std::operator<<(poVar2,(string *)local_248);
  std::operator<<(poVar2,"\'\n");
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "Running FER decoding test on channel parameter p : ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c8);
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"Max number of BP decoder iterations: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)local_158);
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"Max number of frames to simulate: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_f8);
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"Quit at n frame errors: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_128);
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"PRNG seed: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_188);
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"Update console every n frames: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1b8);
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"Code size before rate adaption: ");
  sVar3 = LDPC4QKD::RateAdaptiveCode<unsigned_int>::get_n_rows_mother_matrix
                    ((RateAdaptiveCode<unsigned_int> *)&rng._M_p);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2," x ");
  sVar3 = LDPC4QKD::RateAdaptiveCode<unsigned_int>::getNCols
                    ((RateAdaptiveCode<unsigned_int> *)&rng._M_p);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"Code size after rate adaption (if applicable): ");
  sVar3 = LDPC4QKD::RateAdaptiveCode<unsigned_int>::get_n_rows_after_rate_adaption
                    ((RateAdaptiveCode<unsigned_int> *)&rng._M_p);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2," x ");
  sVar3 = LDPC4QKD::RateAdaptiveCode<unsigned_int>::getNCols
                    ((RateAdaptiveCode<unsigned_int> *)&rng._M_p);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar3);
  poVar2 = std::operator<<(poVar2,"\n\n");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)&begin,local_188);
  result.second = std::chrono::_V2::steady_clock::now();
  pVar9 = run_simulation<unsigned_int>
                    ((RateAdaptiveCode<unsigned_int> *)&rng._M_p,local_c8,local_f8,
                     (mt19937_64 *)&begin,local_158,local_1b8,local_128);
  uVar5 = pVar9.second;
  auVar7._8_4_ = pVar9.first._4_4_;
  auVar7._0_8_ = pVar9.first;
  auVar7._12_4_ = 0x45300000;
  auVar8._8_4_ = pVar9.second._4_4_;
  auVar8._0_8_ = uVar5;
  auVar8._12_4_ = 0x45300000;
  now.__d.__r = (duration)
                (((auVar7._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)pVar9.first) - 4503599627370496.0)) /
                ((auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)pVar9.second) - 4503599627370496.0)));
  result.first = uVar5;
  local_d18.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  poVar2 = std::operator<<((ostream *)&std::cout,"\n\nDONE! Simulation time: ");
  local_d28.__r =
       (rep)std::chrono::operator-
                      (&local_d18,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)&result.second);
  local_d20.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                      (&local_d28);
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_d20);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar4);
  poVar2 = std::operator<<(poVar2," seconds.");
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"Recorded ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,pVar9.first);
  poVar2 = std::operator<<(poVar2," frame errors out of ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar5);
  poVar2 = std::operator<<(poVar2," (FER~");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)now.__d.__r);
  poVar2 = std::operator<<(poVar2,")...");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

int main(int argc, char *argv[]) {
    // parse command line arguments
    cli::Parser parser(argc, argv, help_text);
    configure_parser(parser);
    parser.run_and_exit_if_error();

    auto p = parser.get<double>("p");
    auto max_num_frames_to_test = parser.get<std::size_t>("mf");
    auto quit_at_n_errors = parser.get<std::size_t>("me");
    auto max_bp_iter = parser.get<std::size_t>("i");
    auto rng_seed = parser.get<std::size_t>("s");
    auto update_console_every_n_frames = parser.get<std::size_t>("upn");
    auto code_file_path = parser.get<std::string>("cp");
    auto rate_adaption_file_path = parser.get<std::string>("rp");
    auto n_line_combs = parser.get<std::size_t>("rn");

    // create LDPC code, with rate adaption if specified.
    auto H = load_ldpc(code_file_path, rate_adaption_file_path);
    // set rate adaption. Only works if rate adaption was specified!
    H.set_rate(n_line_combs);

    // print received arguments (simulation parameters)
    std::cout << std::endl;
    std::cout << "Code path: '" << code_file_path << "'\n";
    std::cout << "Rate adaption path: '" << rate_adaption_file_path << "'\n";
    std::cout << "Running FER decoding test on channel parameter p : " << p << '\n';
    std::cout << "Max number of BP decoder iterations: " << static_cast<int>(max_bp_iter) << '\n';
    std::cout << "Max number of frames to simulate: " << max_num_frames_to_test << '\n';
    std::cout << "Quit at n frame errors: " << quit_at_n_errors << '\n';
    std::cout << "PRNG seed: " << rng_seed << '\n';
    std::cout << "Update console every n frames: " << update_console_every_n_frames << '\n';
    std::cout << "Code size before rate adaption: " << H.get_n_rows_mother_matrix() << " x " << H.getNCols() << '\n';
    std::cout << "Code size after rate adaption (if applicable): "
              << H.get_n_rows_after_rate_adaption() << " x " << H.getNCols() << "\n\n" << std::endl;

    std::mt19937_64 rng(rng_seed);
    auto begin = std::chrono::steady_clock::now();

    // perform frame error rate simulation.
    std::pair<std::size_t, std::size_t> result = run_simulation(H, p, max_num_frames_to_test, rng,
                                                                max_bp_iter,
                                                                update_console_every_n_frames, quit_at_n_errors);
    std::size_t num_frame_errors = result.first;
    std::size_t num_frames_tested = result.second;
    double naive_fer = static_cast<double>(num_frame_errors) / static_cast<double>(num_frames_tested);

    auto now = std::chrono::steady_clock::now();
    std::cout << "\n\nDONE! Simulation time: " <<
              std::chrono::duration_cast<std::chrono::seconds>(now - begin).count() << " seconds." << '\n';

    std::cout << "Recorded " << num_frame_errors << " frame errors out of " << num_frames_tested
              << " (FER~" << naive_fer << ")..." << std::endl;

    exit(EXIT_SUCCESS);
}